

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

int lyxml_print_mem(char **strp,lyxml_elem *elem,int options)

{
  int local_6c;
  undefined1 local_68 [4];
  int r;
  lyout out;
  int options_local;
  lyxml_elem *elem_local;
  char **strp_local;
  
  if ((strp == (char **)0x0) || (elem == (lyxml_elem *)0x0)) {
    strp_local._4_4_ = 0;
  }
  else {
    out.hole_count._4_4_ = options;
    memset(local_68,0,0x40);
    local_68 = (undefined1  [4])0x2;
    if ((out.hole_count._4_4_ & 0x10) == 0) {
      local_6c = dump_elem((lyout *)local_68,elem,0,out.hole_count._4_4_,1);
    }
    else {
      local_6c = dump_siblings((lyout *)local_68,elem,out.hole_count._4_4_);
    }
    *strp = (char *)out._0_8_;
    strp_local._4_4_ = local_6c;
  }
  return strp_local._4_4_;
}

Assistant:

API int
lyxml_print_mem(char **strp, const struct lyxml_elem *elem, int options)
{
    struct lyout out;
    int r;

    if (!strp || !elem) {
        return 0;
    }

    memset(&out, 0, sizeof out);

    out.type = LYOUT_MEMORY;

    if (options & LYXML_PRINT_SIBLINGS) {
        r = dump_siblings(&out, elem, options);
    } else {
        r = dump_elem(&out, elem, 0, options, 1);
    }

    *strp = out.method.mem.buf;
    return r;
}